

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O3

void prt_map(void)

{
  term *t;
  chunk_conflict *pcVar1;
  term *t_00;
  _Bool _Var2;
  loc lVar3;
  wchar_t wVar4;
  uint uVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t c_00;
  int iVar10;
  long lVar11;
  wchar_t wVar12;
  int x;
  int iVar13;
  wchar_t tc;
  wchar_t c;
  wchar_t ta;
  wchar_t a;
  grid_data g;
  wchar_t local_7c;
  wchar_t local_70;
  wchar_t local_6c;
  wchar_t local_68;
  wchar_t local_64;
  long local_60;
  grid_data local_58;
  
  lVar11 = 0;
  do {
    t_00 = Term;
    t = angband_term[lVar11];
    if (t != (term *)0x0) {
      uVar5 = window_flag[lVar11];
      if ((uVar5 & 0xa0) != 0) {
        if ((uVar5 & 0x20) == 0) {
          wVar4 = t->wid;
          wVar8 = t->hgt;
          wVar12 = L'\0';
          iVar13 = 0;
          if (-1 < (char)uVar5) {
            iVar13 = row_bottom_map[Term->sidebar_mode];
          }
          if (0 < wVar8 / (int)(uint)tile_height) {
            iVar10 = t->offset_y;
            iVar9 = wVar8 / (int)(uint)tile_height + iVar10;
            iVar6 = wVar4 / (int)(uint)tile_width + t->offset_x;
            wVar12 = L'\0';
            local_60 = lVar11;
            do {
              x = t->offset_x;
              wVar7 = L'\0';
              if (x < iVar6) {
                wVar7 = L'\0';
                do {
                  pcVar1 = cave;
                  lVar3 = (loc)loc(x,iVar10);
                  _Var2 = square_in_bounds(pcVar1,lVar3);
                  if (_Var2) {
                    lVar3 = (loc)loc(x,iVar10);
                    map_info(lVar3,&local_58);
                    grid_data_as_text(&local_58,&local_64,&local_6c,&local_68,&local_70);
                    Term_queue_char(t,wVar7,wVar12,local_64,local_6c,local_68,local_70);
                    if ((1 < tile_width) || (1 < tile_height)) {
                      wVar4 = L'ÿ';
                      c_00 = L'\xffffffff';
LAB_001f40c5:
                      Term_big_queue_char(t,wVar7,wVar12,wVar8 - iVar13,wVar4,c_00,L'\0',L'\0');
                    }
                  }
                  else {
                    Term_queue_char(t,wVar7,wVar12,L'\x01',L' ',L'\0',L'\0');
                    if ((1 < tile_width) || (1 < tile_height)) {
                      wVar4 = L'\x01';
                      c_00 = L' ';
                      goto LAB_001f40c5;
                    }
                  }
                  wVar7 = wVar7 + (uint)tile_width;
                  x = x + 1;
                } while (iVar6 != x);
                wVar4 = t->wid;
              }
              for (; wVar7 < wVar4; wVar7 = wVar7 + L'\x01') {
                Term_queue_char(t,wVar7,wVar12,L'\x01',L' ',L'\0',L'\0');
                wVar4 = t->wid;
              }
              wVar12 = wVar12 + (uint)tile_height;
              iVar10 = iVar10 + 1;
            } while (iVar10 < iVar9);
            wVar8 = t->hgt;
            lVar11 = local_60;
          }
          for (; wVar12 < wVar8; wVar12 = wVar12 + L'\x01') {
            if (L'\0' < wVar4) {
              wVar8 = L'\0';
              do {
                Term_queue_char(t,wVar8,wVar12,L'\x01',L' ',L'\0',L'\0');
                wVar8 = wVar8 + L'\x01';
                wVar4 = t->wid;
              } while (wVar8 < wVar4);
              wVar8 = t->hgt;
            }
          }
        }
        else {
          Term_activate(t);
          display_map((int *)0x0,(int *)0x0);
          Term_activate(t_00);
        }
      }
    }
    lVar11 = lVar11 + 1;
    if (lVar11 == 8) {
      iVar13 = Term->sidebar_mode;
      local_7c = row_top_map[iVar13];
      iVar10 = Term->hgt - (row_bottom_map[iVar13] + local_7c);
      uVar5 = (uint)tile_height;
      iVar6 = iVar10 / (int)(uint)tile_height;
      if (0 < iVar6) {
        iVar9 = Term->offset_y;
        iVar6 = iVar6 + iVar9;
        iVar13 = (~col_map[iVar13] + Term->wid) / (int)(uint)tile_width + Term->offset_x;
        wVar4 = iVar10 + local_7c;
        do {
          iVar10 = Term->offset_x;
          if (iVar10 < iVar13) {
            wVar8 = col_map[Term->sidebar_mode];
            do {
              pcVar1 = cave;
              lVar3 = (loc)loc(iVar10,iVar9);
              _Var2 = square_in_bounds(pcVar1,lVar3);
              if (_Var2) {
                lVar3 = (loc)loc(iVar10,iVar9);
                map_info(lVar3,&local_58);
                grid_data_as_text(&local_58,&local_64,&local_6c,&local_68,&local_70);
                wVar7 = local_64;
                wVar12 = local_6c;
                Term_queue_char(Term,wVar8,local_7c,local_64,local_6c,local_68,local_70);
                if ((1 < tile_width) || (1 < tile_height)) {
                  Term_big_queue_char(Term,wVar8,local_7c,wVar4,wVar7,wVar12,L'\x01',L' ');
                }
              }
              wVar8 = wVar8 + (uint)tile_width;
              iVar10 = iVar10 + 1;
            } while (iVar13 != iVar10);
            uVar5 = (uint)tile_height;
          }
          local_7c = local_7c + uVar5;
          iVar9 = iVar9 + 1;
        } while (iVar9 < iVar6);
      }
      return;
    }
  } while( true );
}

Assistant:

void prt_map(void)
{
	int a, ta;
	wchar_t c, tc;
	struct grid_data g;

	int y, x;
	int vy, vx;
	int ty, tx;
	int clipy;

	/* Redraw map sub-windows */
	prt_map_aux();

	/* Assume screen */
	ty = Term->offset_y + SCREEN_HGT;
	tx = Term->offset_x + SCREEN_WID;

	/* Avoid overwriting the last row with padding for big tiles. */
	clipy = ROW_MAP + SCREEN_ROWS;

	/* Dump the map */
	for (y = Term->offset_y, vy = ROW_MAP; y < ty; vy += tile_height, y++)
		for (x = Term->offset_x, vx = COL_MAP; x < tx; vx += tile_width, x++) {
			/* Check bounds */
			if (!square_in_bounds(cave, loc(x, y))) continue;

			/* Determine what is there */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Hack -- Queue it */
			Term_queue_char(Term, vx, vy, a, c, ta, tc);

			if ((tile_width > 1) || (tile_height > 1))
				Term_big_queue_char(Term, vx, vy, clipy, a, c,
					COLOUR_WHITE, L' ');
		}
}